

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O2

void __thiscall IsoWriter::writeLogicalVolumeIntegrityDescriptor(IsoWriter *this)

{
  uint8_t *buffer;
  int iVar1;
  ulong uVar2;
  size_t __n;
  uint32_t *buff32;
  
  buffer = this->m_buffer;
  memset(buffer,0,0x800);
  uVar2 = (this->m_file).m_pos;
  iVar1 = this->m_tagLocationBaseAddr;
  this->m_buffer[0] = '\t';
  this->m_buffer[1] = '\0';
  this->m_buffer[2] = '\x03';
  this->m_buffer[3] = '\0';
  this->m_buffer[6] = '\x01';
  this->m_buffer[7] = '\0';
  *(int *)(this->m_buffer + 0xc) = (int)(uVar2 >> 0xb) - iVar1;
  anon_unknown.dwarf_cd2a3::writeTimestamp(this->m_buffer + 0x10,this->m_currentTime);
  this->m_buffer[0x1c] = '\x01';
  this->m_buffer[0x1d] = '\0';
  this->m_buffer[0x1e] = '\0';
  this->m_buffer[0x1f] = '\0';
  this->m_buffer[0x20] = '\0';
  this->m_buffer[0x21] = '\0';
  this->m_buffer[0x22] = '\0';
  this->m_buffer[0x23] = '\0';
  this->m_buffer[0x24] = '\0';
  this->m_buffer[0x25] = '\0';
  this->m_buffer[0x26] = '\0';
  this->m_buffer[0x27] = '\0';
  *(uint *)(this->m_buffer + 0x28) = (uint)this->m_objectUniqId;
  this->m_buffer[0x2c] = '\0';
  this->m_buffer[0x2d] = '\0';
  this->m_buffer[0x2e] = '\0';
  this->m_buffer[0x2f] = '\0';
  this->m_buffer[0x48] = '\x02';
  this->m_buffer[0x49] = '\0';
  this->m_buffer[0x4a] = '\0';
  this->m_buffer[0x4b] = '\0';
  iVar1 = (int)(this->m_appId)._M_string_length;
  *(int *)(this->m_buffer + 0x4c) = iVar1 + 0x2e;
  this->m_buffer[0x50] = '\0';
  this->m_buffer[0x51] = '\0';
  this->m_buffer[0x52] = '\0';
  this->m_buffer[0x53] = '\0';
  this->m_buffer[0x54] = '\0';
  this->m_buffer[0x55] = '\0';
  this->m_buffer[0x56] = '\0';
  this->m_buffer[0x57] = '\0';
  *(int *)(this->m_buffer + 0x58) = this->m_partitionEndAddress - this->m_partitionStartAddress;
  __n = 0x800;
  *(int *)(this->m_buffer + 0x5c) = this->m_metadataFileLen / 0x800;
  strcpy((char *)(this->m_buffer + 0x61),(this->m_impId)._M_dataplus._M_p);
  *(undefined8 *)(this->m_buffer + 0x80) = *(undefined8 *)&this->m_totalFiles;
  this->m_buffer[0x88] = 'P';
  this->m_buffer[0x89] = '\x02';
  this->m_buffer[0x8a] = 'P';
  this->m_buffer[0x8b] = '\x02';
  this->m_buffer[0x8c] = 'P';
  this->m_buffer[0x8d] = '\x02';
  strcpy((char *)(this->m_buffer + 0x8e),(this->m_appId)._M_dataplus._M_p);
  anon_unknown.dwarf_cd2a3::calcDescriptorCRC(buffer,(short)iVar1 + 0x8e);
  File::write(&this->m_file,(int)buffer,(void *)0x800,__n);
  return;
}

Assistant:

void IsoWriter::writeLogicalVolumeIntegrityDescriptor()
{
    memset(m_buffer, 0, sizeof(m_buffer));
    writeDescriptorTag(m_buffer, DescriptorTag::LogicalVolIntegrity, absoluteSectorNum());

    const auto buff32 = reinterpret_cast<uint32_t *>(m_buffer);
    const auto buff16 = reinterpret_cast<uint16_t *>(m_buffer);

    writeTimestamp(m_buffer + 16, m_currentTime);
    buff32[7] = 0x01;              // Integrity Type
    buff32[8] = buff32[9] = 0x00;  // Next Integrity Extent
    // Logical Volume Contents Use (32 bytes)
    buff32[10] = m_objectUniqId;
    buff32[11] = 0;  // uniq ID hi

    buff32[72 / 4] = 0x02;                                             // Number of Partitions
    buff32[76 / 4] = static_cast<uint32_t>(46 + m_appId.size());       // Length of Implementation Use
    buff32[80 / 4] = buff32[84 / 4] = 0;                               // Free Space Table
    buff32[88 / 4] = m_partitionEndAddress - m_partitionStartAddress;  // main partition size
    buff32[92 / 4] = m_metadataFileLen / SECTOR_SIZE;

    strcpy(reinterpret_cast<char *>(m_buffer) + 97, m_impId.c_str());

    buff32[0x80 / 4] = m_totalFiles;
    buff32[0x84 / 4] = m_totalDirectories;
    buff16[0x88 / 2] = 0x0250;  // Minimum UDF Read Revision
    buff16[0x8a / 2] = 0x0250;  // Minimum UDF Write Revision
    buff16[0x8c / 2] = 0x0250;  // Maximum UDF Write Revision

    strcpy(reinterpret_cast<char *>(m_buffer) + 142, m_appId.c_str());

    calcDescriptorCRC(m_buffer, static_cast<uint16_t>(142 + m_appId.size()));
    m_file.write(m_buffer, SECTOR_SIZE);
}